

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caption.c
# Opt level: O0

int caption_frame_from_text(caption_frame_t *frame,utf8_char_t *data)

{
  int iVar1;
  char *c_00;
  char *in_RSI;
  long in_RDI;
  bool bVar2;
  size_t char_length;
  size_t c;
  utf8_size_t char_count;
  size_t s;
  size_t r;
  ssize_t size;
  ulong uVar3;
  utf8_size_t in_stack_ffffffffffffffd0;
  caption_frame_t *in_stack_ffffffffffffffd8;
  ulong local_20;
  size_t local_18;
  char *local_10;
  
  local_18 = strlen(in_RSI);
  caption_frame_init((caption_frame_t *)0x105ae7);
  *(long *)(in_RDI + 0x1e40) = in_RDI + 0xf40;
  local_20 = 0;
  local_10 = in_RSI;
  while( true ) {
    bVar2 = false;
    if ((*local_10 != '\0') && (bVar2 = false, local_18 != 0)) {
      bVar2 = local_20 < 0xf;
    }
    if (!bVar2) break;
    while( true ) {
      bVar2 = false;
      if (local_18 != 0) {
        iVar1 = utf8_char_whitespace(local_10);
        bVar2 = iVar1 != 0;
      }
      if (!bVar2) break;
      in_stack_ffffffffffffffd8 = (caption_frame_t *)utf8_char_length(local_10);
      local_10 = local_10 + (long)(&in_stack_ffffffffffffffd8->xds + -1) + 0x28;
      local_18 = local_18 - (long)in_stack_ffffffffffffffd8;
    }
    in_stack_ffffffffffffffd0 =
         utf8_wrap_length((utf8_char_t *)in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
    for (uVar3 = 0; uVar3 < in_stack_ffffffffffffffd0; uVar3 = uVar3 + 1) {
      c_00 = (char *)utf8_char_length(local_10);
      caption_frame_write_char
                (in_stack_ffffffffffffffd8,(int)(in_stack_ffffffffffffffd0 >> 0x20),
                 (int)in_stack_ffffffffffffffd0,(eia608_style_t)(uVar3 >> 0x20),(int)uVar3,c_00);
      local_10 = c_00 + (long)local_10;
      local_18 = local_18 - (long)c_00;
    }
    local_20 = (long)(int)(uint)(in_stack_ffffffffffffffd0 != 0) + local_20;
  }
  caption_frame_end((caption_frame_t *)0x105c5d);
  return 0;
}

Assistant:

int caption_frame_from_text(caption_frame_t* frame, const utf8_char_t* data)
{
    ssize_t size = (ssize_t)strlen(data);
    caption_frame_init(frame);
    frame->write = &frame->back;

    for (size_t r = 0; (*data) && size && r < SCREEN_ROWS;) {
        // skip whitespace at start of line
        while (size && utf8_char_whitespace(data)) {
            size_t s = utf8_char_length(data);
            data += s, size -= s;
        }

        // get charcter count for wrap (or orest of line)
        utf8_size_t char_count = utf8_wrap_length(data, SCREEN_COLS);
        // write to caption frame
        for (size_t c = 0; c < char_count; ++c) {
            size_t char_length = utf8_char_length(data);
            caption_frame_write_char(frame, r, c, eia608_style_white, 0, data);
            data += char_length, size -= char_length;
        }

        r += char_count ? 1 : 0; // Update row num only if not blank
    }

    caption_frame_end(frame);
    return 0;
}